

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSha1.c
# Opt level: O3

void deSha1Stream_init(deSha1Stream *stream)

{
  stream->size = 0;
  stream->data[0] = 0;
  stream->data[1] = 0;
  stream->data[2] = 0;
  stream->data[3] = 0;
  stream->data[4] = 0;
  stream->data[5] = 0;
  stream->data[6] = 0;
  stream->data[7] = 0;
  stream->data[8] = 0;
  stream->data[9] = 0;
  stream->data[10] = 0;
  stream->data[0xb] = 0;
  stream->data[0xc] = 0;
  stream->data[0xd] = 0;
  stream->data[0xe] = 0;
  stream->data[0xf] = 0;
  stream->hash[0] = 0x67452301;
  stream->hash[1] = 0xefcdab89;
  stream->hash[2] = 0x98badcfe;
  stream->hash[3] = 0x10325476;
  stream->hash[4] = 0xc3d2e1f0;
  return;
}

Assistant:

void deSha1Stream_init (deSha1Stream* stream)
{
	stream->size = 0;

	/* Set the initial 16 deUint32s that contain real data to zeros. */
	deMemset(stream->data, 0, 16 * sizeof(deUint32));

	stream->hash[0] = 0x67452301u;
	stream->hash[1] = 0xEFCDAB89u;
	stream->hash[2] = 0x98BADCFEu;
	stream->hash[3] = 0x10325476u;
	stream->hash[4] = 0xC3D2E1F0u;
}